

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Reader.cpp
# Opt level: O0

Barcode * __thiscall
ZXing::OneD::Code93Reader::decodePattern
          (Code93Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_4)

{
  bool bVar1;
  AIFlag AVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  value_type vVar5;
  int y;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  PatternView *in_RCX;
  Barcode *in_RDI;
  int xStop;
  SymbologyIdentifier symbologyIdentifier;
  Error error;
  string txt;
  int xStart;
  int minCharCount;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  Error *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  float in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd34;
  Type in_stack_fffffffffffffd35;
  short in_stack_fffffffffffffd36;
  int in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  Error *in_stack_fffffffffffffd40;
  Error *this_00;
  byte local_2b1;
  string *__a;
  string *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  undefined8 in_stack_fffffffffffffd68;
  PatternView *in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd86;
  string *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined1 readerInit;
  string *psVar9;
  int in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  Result *in_stack_fffffffffffffdb0;
  SymbologyIdentifier in_stack_fffffffffffffdc0;
  Error *in_stack_fffffffffffffdc8;
  undefined1 local_1c1 [87];
  byte local_16a;
  byte local_169;
  string local_168 [32];
  string local_148 [32];
  string local_128 [80];
  Error local_d8;
  Iterator local_a8;
  undefined8 uStack_a0;
  Iterator local_98;
  Iterator puStack_90;
  undefined4 local_88;
  string local_78 [36];
  int local_54;
  Iterator local_50;
  undefined8 local_48;
  Iterator local_40;
  Iterator local_38;
  int local_2c;
  PatternView *local_20;
  
  local_2c = 5;
  local_20 = in_RCX;
  FindLeftGuard<6,bool(*)(ZXing::PatternView_const&,int)>
            (in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
             (_func_bool_PatternView_ptr_int *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  local_20->_data = local_50;
  *(undefined8 *)&local_20->_size = local_48;
  local_20->_base = local_40;
  local_20->_end = local_38;
  bVar1 = PatternView::isValid((PatternView *)in_stack_fffffffffffffd20);
  if (!bVar1) {
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    return in_RDI;
  }
  local_54 = PatternView::pixelsInFront((PatternView *)in_stack_fffffffffffffd20);
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::reserve((ulong)local_78);
  do {
    bVar1 = PatternView::skipSymbol((PatternView *)0x28b95a);
    if (!bVar1) {
      in_RDI->_format = None;
      in_RDI->_ecLevel[0] = '\0';
      in_RDI->_ecLevel[1] = '\0';
      in_RDI->_ecLevel[2] = '\0';
      in_RDI->_ecLevel[3] = '\0';
      in_RDI->_version[0] = '\0';
      in_RDI->_version[1] = '\0';
      in_RDI->_version[2] = '\0';
      in_RDI->_version[3] = '\0';
      in_RDI->_lineCount = 0;
      (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
      *(undefined8 *)&(in_RDI->_sai).id = 0;
      (in_RDI->_sai).id._M_string_length = 0;
      *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
      (in_RDI->_sai).index = 0;
      (in_RDI->_sai).count = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      *(undefined8 *)&in_RDI->_readerOpts = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      (in_RDI->_error)._line = 0;
      (in_RDI->_error)._type = None;
      *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
      (in_RDI->_error)._file = (char *)0x0;
      (in_RDI->_error)._msg._M_string_length = 0;
      (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
      (in_RDI->_content).symbology.code = '\0';
      (in_RDI->_content).symbology.modifier = '\0';
      (in_RDI->_content).symbology.eciModifierOffset = '\0';
      (in_RDI->_content).symbology.aiFlag = None;
      (in_RDI->_content).defaultCharset = Unknown;
      (in_RDI->_content).hasECI = false;
      *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
      *(undefined8 *)&(in_RDI->_error)._msg = 0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      in_RDI->_isMirrored = false;
      in_RDI->_isInverted = false;
      in_RDI->_readerInit = false;
      *(undefined5 *)&in_RDI->field_0xd3 = 0;
      Result::Result((Result *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
      local_88 = 1;
      goto LAB_0028c0fa;
    }
    OneD::RowReader::OneToFourBitPattern<6,9>
              ((PatternView *)
               CONCAT26(in_stack_fffffffffffffd36,
                        CONCAT15(in_stack_fffffffffffffd35,
                                 CONCAT14(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30))));
    AVar2 = OneD::RowReader::LookupBitPattern<int[48],char[49]>
                      (CONCAT22(in_stack_fffffffffffffd36,
                                CONCAT11(in_stack_fffffffffffffd35,in_stack_fffffffffffffd34)),
                       (int (*) [48])CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       (char (*) [49])in_stack_fffffffffffffd20);
    in_stack_fffffffffffffdc0.aiFlag = AVar2;
    std::__cxx11::string::operator+=(local_78,AVar2);
    pcVar8 = (char *)std::__cxx11::string::back();
    if (*pcVar8 == '\0') {
      in_RDI->_format = None;
      in_RDI->_ecLevel[0] = '\0';
      in_RDI->_ecLevel[1] = '\0';
      in_RDI->_ecLevel[2] = '\0';
      in_RDI->_ecLevel[3] = '\0';
      in_RDI->_version[0] = '\0';
      in_RDI->_version[1] = '\0';
      in_RDI->_version[2] = '\0';
      in_RDI->_version[3] = '\0';
      in_RDI->_lineCount = 0;
      (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
      *(undefined8 *)&(in_RDI->_sai).id = 0;
      (in_RDI->_sai).id._M_string_length = 0;
      *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
      (in_RDI->_sai).index = 0;
      (in_RDI->_sai).count = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      *(undefined8 *)&in_RDI->_readerOpts = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      (in_RDI->_error)._line = 0;
      (in_RDI->_error)._type = None;
      *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
      (in_RDI->_error)._file = (char *)0x0;
      (in_RDI->_error)._msg._M_string_length = 0;
      (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
      (in_RDI->_content).symbology.code = '\0';
      (in_RDI->_content).symbology.modifier = '\0';
      (in_RDI->_content).symbology.eciModifierOffset = '\0';
      (in_RDI->_content).symbology.aiFlag = None;
      (in_RDI->_content).defaultCharset = Unknown;
      (in_RDI->_content).hasECI = false;
      *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
      *(undefined8 *)&(in_RDI->_error)._msg = 0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      in_RDI->_isMirrored = false;
      in_RDI->_isInverted = false;
      in_RDI->_readerInit = false;
      *(undefined5 *)&in_RDI->field_0xd3 = 0;
      Result::Result((Result *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
      local_88 = 1;
      goto LAB_0028c0fa;
    }
    pcVar8 = (char *)std::__cxx11::string::back();
    readerInit = (undefined1)((ulong)in_stack_fffffffffffffd90 >> 0x38);
  } while (*pcVar8 != '*');
  psVar9 = local_78;
  std::__cxx11::string::pop_back();
  y = Size<std::__cxx11::string>(&in_stack_fffffffffffffd20->_msg);
  if (y < local_2c + -2) {
    in_RDI->_format = None;
    in_RDI->_ecLevel[0] = '\0';
    in_RDI->_ecLevel[1] = '\0';
    in_RDI->_ecLevel[2] = '\0';
    in_RDI->_ecLevel[3] = '\0';
    in_RDI->_version[0] = '\0';
    in_RDI->_version[1] = '\0';
    in_RDI->_version[2] = '\0';
    in_RDI->_version[3] = '\0';
    in_RDI->_lineCount = 0;
    (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
    *(undefined8 *)&(in_RDI->_sai).id = 0;
    (in_RDI->_sai).id._M_string_length = 0;
    *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
    (in_RDI->_sai).index = 0;
    (in_RDI->_sai).count = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    *(undefined8 *)&in_RDI->_readerOpts = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (in_RDI->_error)._line = 0;
    (in_RDI->_error)._type = None;
    *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
    (in_RDI->_error)._file = (char *)0x0;
    (in_RDI->_error)._msg._M_string_length = 0;
    (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
    (in_RDI->_content).symbology.code = '\0';
    (in_RDI->_content).symbology.modifier = '\0';
    (in_RDI->_content).symbology.eciModifierOffset = '\0';
    (in_RDI->_content).symbology.aiFlag = None;
    (in_RDI->_content).defaultCharset = Unknown;
    (in_RDI->_content).hasECI = false;
    *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
    *(undefined8 *)&(in_RDI->_error)._msg = 0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    in_RDI->_isMirrored = false;
    in_RDI->_isInverted = false;
    in_RDI->_readerInit = false;
    *(undefined5 *)&in_RDI->field_0xd3 = 0;
    Result::Result((Result *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    local_88 = 1;
  }
  else {
    PatternView::subView
              ((PatternView *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
               in_stack_fffffffffffffd38);
    local_20->_base = local_98;
    local_20->_end = puStack_90;
    local_20->_data = local_a8;
    *(undefined8 *)&local_20->_size = uStack_a0;
    uVar3 = PatternView::isValid((PatternView *)in_stack_fffffffffffffd20);
    if ((bool)uVar3) {
      vVar5 = PatternView::operator[](local_20,6);
      uVar6 = (uint)vVar5;
      iVar7 = PatternView::sum((PatternView *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      if (((int)uVar6 <= iVar7 / 4) &&
         (bVar1 = PatternView::hasQuietZoneAfter<true>
                            ((PatternView *)
                             CONCAT26(in_stack_fffffffffffffd36,
                                      CONCAT15(in_stack_fffffffffffffd35,
                                               CONCAT14(in_stack_fffffffffffffd34,
                                                        in_stack_fffffffffffffd30))),
                             in_stack_fffffffffffffd2c), bVar1)) {
        Error::Error(in_stack_fffffffffffffd20);
        uVar4 = CheckChecksums(&in_stack_fffffffffffffd20->_msg);
        if (!(bool)uVar4) {
          in_stack_fffffffffffffd58 = local_128;
          std::__cxx11::string::string(in_stack_fffffffffffffd58);
          Error::Error(in_stack_fffffffffffffd40,
                       (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                       in_stack_fffffffffffffd36,in_stack_fffffffffffffd35,
                       (string *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          Error::operator=(in_stack_fffffffffffffd20,
                           (Error *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          Error::~Error((Error *)0x28bd7e);
          std::__cxx11::string::~string(local_128);
        }
        __a = local_78;
        std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)__a);
        bVar1 = Error::operator_cast_to_bool(&local_d8);
        local_169 = 0;
        local_16a = 0;
        local_2b1 = 0;
        if (!bVar1) {
          std::__cxx11::string::string(local_168,local_78);
          local_169 = 1;
          DecodeCode39AndCode93FullASCII
                    (in_stack_fffffffffffffd88,
                     (char *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffd86,CONCAT24(vVar5,iVar7)
                                                    )));
          local_16a = 1;
          std::__cxx11::string::operator=(local_78,local_148);
          local_2b1 = std::__cxx11::string::empty();
        }
        if ((local_16a & 1) != 0) {
          std::__cxx11::string::~string(local_148);
        }
        if ((local_169 & 1) != 0) {
          std::__cxx11::string::~string(local_168);
        }
        if ((local_2b1 & 1) != 0) {
          this_00 = (Error *)local_1c1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar4,in_stack_fffffffffffffd60),(char *)in_stack_fffffffffffffd58,
                     (allocator<char> *)__a);
          Error::Error(this_00,(char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
                       ,in_stack_fffffffffffffd36,in_stack_fffffffffffffd35,
                       (string *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          Error::operator=(in_stack_fffffffffffffd20,
                           (Error *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          Error::~Error((Error *)0x28bf3f);
          std::__cxx11::string::~string((string *)(local_1c1 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_1c1);
        }
        PatternView::pixelsTillEnd((PatternView *)in_stack_fffffffffffffd20);
        Error::Error(in_stack_fffffffffffffd20,
                     (Error *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        Result::Result(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,y,
                       in_stack_fffffffffffffda0,(int)((ulong)psVar9 >> 0x20),(BarcodeFormat)psVar9,
                       in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,(bool)readerInit);
        Error::~Error((Error *)0x28c0b0);
        local_88 = 1;
        Error::~Error((Error *)0x28c0c8);
        goto LAB_0028c0fa;
      }
    }
    in_RDI->_format = None;
    in_RDI->_ecLevel[0] = '\0';
    in_RDI->_ecLevel[1] = '\0';
    in_RDI->_ecLevel[2] = '\0';
    in_RDI->_ecLevel[3] = '\0';
    in_RDI->_version[0] = '\0';
    in_RDI->_version[1] = '\0';
    in_RDI->_version[2] = '\0';
    in_RDI->_version[3] = '\0';
    in_RDI->_lineCount = 0;
    (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
    *(undefined8 *)&(in_RDI->_sai).id = 0;
    (in_RDI->_sai).id._M_string_length = 0;
    *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
    (in_RDI->_sai).index = 0;
    (in_RDI->_sai).count = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    *(undefined8 *)&in_RDI->_readerOpts = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (in_RDI->_error)._line = 0;
    (in_RDI->_error)._type = None;
    *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
    (in_RDI->_error)._file = (char *)0x0;
    (in_RDI->_error)._msg._M_string_length = 0;
    (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
    (in_RDI->_content).symbology.code = '\0';
    (in_RDI->_content).symbology.modifier = '\0';
    (in_RDI->_content).symbology.eciModifierOffset = '\0';
    (in_RDI->_content).symbology.aiFlag = None;
    (in_RDI->_content).defaultCharset = Unknown;
    (in_RDI->_content).hasECI = false;
    *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
    *(undefined8 *)&(in_RDI->_error)._msg = 0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    in_RDI->_isMirrored = false;
    in_RDI->_isInverted = false;
    in_RDI->_readerInit = false;
    *(undefined5 *)&in_RDI->field_0xd3 = 0;
    Result::Result((Result *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    local_88 = 1;
  }
LAB_0028c0fa:
  std::__cxx11::string::~string(local_78);
  return in_RDI;
}

Assistant:

Barcode Code93Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop, checksum and 1 payload characters)
	int minCharCount = 5;

	next = FindLeftGuard<CHAR_LEN>(next, minCharCount * CHAR_LEN, IsStartGuard);
	if (!next.isValid())
		return {};

	int xStart = next.pixelsInFront();

	std::string txt;
	txt.reserve(20);

	do {
		// check remaining input width
		if (!next.skipSymbol())
			return {};

		txt += LookupBitPattern(OneToFourBitPattern<CHAR_LEN, CHAR_SUM>(next), CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (txt.back() != '*');

	txt.pop_back(); // remove asterisk

	if (Size(txt) < minCharCount - 2)
		return {};

	// check termination bar (is present and not wider than about 2 modules) and quiet zone
	next = next.subView(0, CHAR_LEN + 1);
	if (!next.isValid() || next[CHAR_LEN] > next.sum(CHAR_LEN) / 4 || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	Error error;
	if (!CheckChecksums(txt))
		error = ChecksumError();

	// Remove checksum digits
	txt.resize(txt.size() - 2);

	if (!error && (txt = DecodeCode39AndCode93FullASCII(txt, "abcd")).empty())
		error = FormatError("ASCII decoding of Code93 failed");

	// Symbology identifier ISO/IEC 15424:2008 4.4.10 no modifiers
	SymbologyIdentifier symbologyIdentifier = {'G', '0'};

	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::Code93, symbologyIdentifier, error);
}